

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::ErrorHandlerImpl::taskFailed(ErrorHandlerImpl *this,Exception *exception)

{
  DebugExpression<bool> _kjCondition;
  StringPtr local_28;
  StringPtr local_18;
  
  local_18.content.size_ = (exception->description).content.size_;
  if (local_18.content.size_ == 0) {
    local_18.content.ptr = "";
  }
  else {
    local_18.content.ptr = (exception->description).content.ptr;
  }
  local_18.content.size_ = local_18.content.size_ + (local_18.content.size_ == 0);
  local_28.content.ptr = "example TaskSet failure";
  local_28.content.size_ = 0x18;
  _kjCondition.value = StringPtr::endsWith(&local_18,&local_28);
  if ((!_kjCondition.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x3b8,ERROR,
               "\"failed: expected \" \"exception.getDescription().endsWith(\\\"example TaskSet failure\\\")\", _kjCondition"
               ,(char (*) [80])
                "failed: expected exception.getDescription().endsWith(\"example TaskSet failure\")",
               &_kjCondition);
  }
  this->exceptionCount = this->exceptionCount + 1;
  return;
}

Assistant:

void taskFailed(kj::Exception&& exception) override {
    EXPECT_TRUE(exception.getDescription().endsWith("example TaskSet failure"));
    ++exceptionCount;
  }